

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

Interval * tcu::operator/(Interval *__return_storage_ptr__,Interval *nom,Interval *den)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  deRoundingMode dVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_88;
  
  dVar11 = den->m_lo;
  dVar10 = den->m_hi;
  __return_storage_ptr__->m_hasNaN = false;
  if ((0.0 < dVar11) || (dVar10 < 0.0)) {
    __return_storage_ptr__->m_lo = INFINITY;
    __return_storage_ptr__->m_hi = -INFINITY;
    dVar9 = nom->m_lo;
    local_88 = nom->m_hi;
    if (dVar9 <= local_88) {
      if (dVar11 <= dVar10) {
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar11 = dVar9 / dVar11;
        dVar10 = dVar11;
        if (NAN(dVar11)) {
          dVar10 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar13 = den->m_hi;
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar9 = dVar9 / dVar13;
        dVar13 = dVar9;
        if (NAN(dVar9)) {
          dVar13 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar12 = (double)(-(ulong)NAN(dVar11) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar11) & (ulong)dVar11);
        dVar14 = (double)(-(ulong)NAN(dVar9) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar9) & (ulong)dVar9);
        bVar7 = -(NAN(dVar11) || NAN(dVar9));
        dVar13 = (double)(~-(ulong)(dVar10 <= dVar13) & (ulong)dVar13 |
                         (ulong)dVar10 & -(ulong)(dVar10 <= dVar13));
        uVar8 = -(ulong)(dVar14 <= dVar12);
        dVar9 = (double)(~uVar8 & (ulong)dVar14 | uVar8 & (ulong)dVar12);
        local_88 = nom->m_hi;
        dVar11 = den->m_lo;
        dVar10 = den->m_hi;
      }
      else {
        bVar7 = 0;
        dVar13 = INFINITY;
        dVar9 = -INFINITY;
      }
      dVar12 = -INFINITY;
      dVar14 = INFINITY;
      bVar1 = den->m_hasNaN;
      if (dVar11 <= dVar10) {
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar11 = local_88 / dVar11;
        dVar10 = dVar11;
        if (NAN(dVar11)) {
          dVar10 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar12 = den->m_hi;
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        local_88 = local_88 / dVar12;
        dVar12 = local_88;
        if (NAN(local_88)) {
          dVar12 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar2 = (double)(-(ulong)NAN(dVar11) & 0xfff0000000000000 |
                        ~-(ulong)NAN(dVar11) & (ulong)dVar11);
        dVar3 = (double)(-(ulong)NAN(local_88) & 0xfff0000000000000 |
                        ~-(ulong)NAN(local_88) & (ulong)local_88);
        bVar4 = (bool)((-NAN(dVar11) | -NAN(local_88)) & 1);
        dVar14 = (double)(~-(ulong)(dVar10 <= dVar12) & (ulong)dVar12 |
                         (ulong)dVar10 & -(ulong)(dVar10 <= dVar12));
        uVar8 = -(ulong)(dVar3 <= dVar2);
        dVar12 = (double)(~uVar8 & (ulong)dVar3 | uVar8 & (ulong)dVar2);
        bVar6 = den->m_hasNaN;
      }
      else {
        bVar4 = false;
        bVar6 = bVar1;
      }
      if ((bVar6 & 1) != 0) {
        bVar4 = true;
      }
      if (((bVar1 | bVar7) & 1) != 0) {
        bVar4 = true;
      }
      dVar10 = (double)(~-(ulong)(dVar13 <= dVar14) & (ulong)dVar14 |
                       (ulong)dVar13 & -(ulong)(dVar13 <= dVar14));
      dVar11 = (double)(~-(ulong)(dVar12 <= dVar9) & (ulong)dVar12 |
                       (ulong)dVar9 & -(ulong)(dVar12 <= dVar9));
    }
    else {
      dVar10 = INFINITY;
      dVar11 = -INFINITY;
      bVar4 = false;
    }
    __return_storage_ptr__->m_hasNaN = bVar4;
    __return_storage_ptr__->m_lo = dVar10;
    __return_storage_ptr__->m_hi = dVar11;
    if (nom->m_hasNaN != true) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->m_hasNaN = true;
  }
  else {
    dVar11 = INFINITY;
    dVar10 = -INFINITY;
  }
  __return_storage_ptr__->m_lo = dVar10;
  __return_storage_ptr__->m_hi = dVar11;
  return __return_storage_ptr__;
}

Assistant:

Interval operator/ (const Interval& nom, const Interval& den)
{
	if (den.contains(0.0))
	{
		// \todo [2014-03-21 lauri] Non-inf endpoint when one den endpoint is
		// zero and nom doesn't cross zero?
		return Interval::unbounded();
	}
	else
	{
		Interval ret;

		TCU_INTERVAL_APPLY_MONOTONE2(ret, nomp, nom, denp, den, val,
									 TCU_SET_INTERVAL(val, point, point = nomp / denp));
		return ret;
	}
}